

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosStream.cpp
# Opt level: O0

void __thiscall adiosStream::Close(adiosStream *this)

{
  long in_RDI;
  int totalRanks;
  int myRank;
  undefined1 local_10 [4];
  int local_c [3];
  
  MPI_Comm_rank(*(undefined8 *)(in_RDI + 0x50),local_c);
  MPI_Comm_size(*(undefined8 *)(in_RDI + 0x50),local_10);
  if (((*(byte *)(in_RDI + 0x40) & 1) != 0) && (local_c[0] == 0)) {
    fclose(*(FILE **)(in_RDI + 0x58));
  }
  adios2::Engine::Close((int)in_RDI + 0x30);
  return;
}

Assistant:

void adiosStream::Close()
{
    int myRank, totalRanks;
    MPI_Comm_rank(comm, &myRank);
    MPI_Comm_size(comm, &totalRanks);
    if (hasIOTimer)
    {
        if (myRank == 0)
        {
            fclose(perfLogFP);
        }
    }
    engine.Close();
}